

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AuxPtrs.h
# Opt level: O2

bool __thiscall
Js::AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType>::Set
          (AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType> *this,AuxPointerType e,
          void *p)

{
  byte bVar1;
  ulong uVar2;
  uint8 u;
  undefined7 in_register_00000031;
  
  uVar2 = CONCAT71(in_register_00000031,e) & 0xffffffff;
  bVar1 = this->offsets[uVar2];
  if (bVar1 == 0xff) {
    bVar1 = this->count;
    if (bVar1 == this->capacity) {
      return false;
    }
    this->count = bVar1 + 1;
    this->offsets[uVar2] = bVar1;
  }
  Memory::WriteBarrierPtr<void>::WriteBarrierSet(this->ptrs + bVar1,p);
  return true;
}

Assistant:

inline bool AuxPtrs<T, FieldsEnum>::Set(FieldsEnum e, void* p)
    {
        uint8 u = (uint8)e;
        if (offsets[u] != (uint8)FieldsEnum::Invalid)
        {
            ptrs[offsets[u]] = p;
            return true;
        }
        else
        {
            if (count == capacity)
            {
                // need to expand
                return false;
            }
            else
            {
                offsets[u] = count++;
                ptrs[(uint8)offsets[u]] = p;
                return true;
            }
        }
    }